

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall amrex::MLCellLinOp::AnyAvgDownResAmr(MLCellLinOp *this,int clev,Any *cres,Any *fres)

{
  int ncomp;
  MultiFab *S_fine;
  MultiFab *S_crse;
  
  S_fine = Any::get<amrex::MultiFab>(fres);
  S_crse = Any::get<amrex::MultiFab>(cres);
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  EB_average_down(S_fine,S_crse,0,ncomp,
                  (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[clev]);
  return;
}

Assistant:

void
MLCellLinOp::AnyAvgDownResAmr (int clev, Any& cres, Any const& fres) const
{
    AMREX_ASSERT(cres.is<MultiFab>() && fres.is<MultiFab>());
#ifdef AMREX_USE_EB
    amrex::EB_average_down
#else
    amrex::average_down
#endif
        (fres.get<MultiFab>(), cres.get<MultiFab>(), 0, getNComp(), AMRRefRatio(clev));
}